

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
wallet::coinselector_tests::NewWallet(NodeContext *m_node,string *wallet_name)

{
  MockableData records;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *in_RDX;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  readonly_property<bool> in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff51;
  shared_count sStack_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock5;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock5.super_unique_lock._M_device = (mutex_type *)wallet_name[4]._M_dataplus._M_p;
  local_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58._M_impl.super__Rb_tree_header._M_header;
  local_58._M_impl._0_8_ = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  records._M_t._M_impl._4_4_ = in_stack_ffffffffffffff2c;
  records._M_t._M_impl._0_4_ = in_stack_ffffffffffffff28;
  records._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = in_stack_ffffffffffffff30;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_ffffffffffffff38;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_ffffffffffffff40;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_ffffffffffffff48;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ =
       (readonly_property<bool>)
       (readonly_property<bool>)in_stack_ffffffffffffff50.super_class_property<bool>.value;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_ = in_stack_ffffffffffffff51;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateMockableWalletDatabase(records);
  std::
  make_unique<wallet::CWallet,interfaces::Chain*,std::__cxx11::string_const&,std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>>
            ((Chain **)m_node,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&criticalblock5,
             in_RDX);
  if ((long *)CONCAT71(in_stack_ffffffffffffff51,
                       in_stack_ffffffffffffff50.super_class_property<bool>.value) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(in_stack_ffffffffffffff51,
                                   in_stack_ffffffffffffff50.super_class_property<bool>.value) + 8))
              ();
  }
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_58);
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0xb7;
  file.m_begin = (iterator)&local_88;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_98,msg);
  CWallet::LoadWallet((CWallet *)
                      (m_node->kernel)._M_t.
                      super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>
                      .super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl);
  sStack_a0.pi_ = (sp_counted_base *)0x0;
  criticalblock5.super_unique_lock._M_owns = false;
  criticalblock5.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_0113a070;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&stack0xffffffffffffff50,(lazy_ostream *)&criticalblock5,1,0,WARN,
             0xc7c78b,(size_t)&stack0xffffffffffffff30,0xb7);
  boost::detail::shared_count::~shared_count(&sStack_a0);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock5,
             (AnnotatedMixin<std::recursive_mutex> *)
             ((m_node->kernel)._M_t.
              super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>._M_t.
              super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
              super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl + 0x1e8),
             "wallet->cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
             ,0xb8,false);
  CWallet::SetWalletFlag
            ((CWallet *)
             (m_node->kernel)._M_t.
             super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>._M_t.
             super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
             super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl,0x400000000);
  CWallet::SetupDescriptorScriptPubKeyMans
            ((CWallet *)
             (m_node->kernel)._M_t.
             super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>._M_t.
             super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
             super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock5.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (__uniq_ptr_data<wallet::CWallet,_std::default_delete<wallet::CWallet>,_true,_true>)
           (__uniq_ptr_data<wallet::CWallet,_std::default_delete<wallet::CWallet>,_true,_true>)
           m_node;
  }
  __stack_chk_fail();
}

Assistant:

static std::unique_ptr<CWallet> NewWallet(const node::NodeContext& m_node, const std::string& wallet_name = "")
{
    std::unique_ptr<CWallet> wallet = std::make_unique<CWallet>(m_node.chain.get(), wallet_name, CreateMockableWalletDatabase());
    BOOST_CHECK(wallet->LoadWallet() == DBErrors::LOAD_OK);
    LOCK(wallet->cs_wallet);
    wallet->SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
    wallet->SetupDescriptorScriptPubKeyMans();
    return wallet;
}